

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall Client::OnConnect(Client *this,Handle *handle,uint32_t error)

{
  mutex *__mutex;
  __int_type _Var1;
  element_type *peVar2;
  int iVar3;
  ostream *poVar4;
  Session *this_00;
  mapped_type *ppSVar5;
  undefined8 uVar6;
  Handle local_38;
  
  if (error != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," something error while connect. error :  ",0x29);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  LOCK();
  (this->_num_connected).super___atomic_base<unsigned_int>._M_i =
       (this->_num_connected).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  _Var1 = (this->_num_connected).super___atomic_base<unsigned_int>._M_i;
  if (_Var1 == this->_session_count) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," sessions all connected",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  this_00 = (Session *)operator_new(0x18);
  this_00->_owner = this;
  this_00->_bytes_read = 0;
  this_00->_messages_read = 0;
  peVar2 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_CNSocket[9])(peVar2,this_00);
  local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Session::OnConnection(this_00,&local_38);
  if (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  __mutex = &this->_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    ppSVar5 = std::__detail::
              _Map_base<std::shared_ptr<cppnet::CNSocket>,_std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::shared_ptr<cppnet::CNSocket>,_std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->_sessions,handle);
    *ppSVar5 = this_00;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

void OnConnect(cppnet::Handle handle, uint32_t error) {
        if (error == cppnet::CEC_SUCCESS) {
            _num_connected++;
            if (_num_connected.load() == _session_count) {
                std::cout << _session_count << " sessions all connected" << std::endl;
            }
            auto session = new Session(this);
            handle->SetContext(session);
            session->OnConnection(handle);

            std::lock_guard<std::mutex> lock(_mutex);
            _sessions[handle] = session;

        } else {
            std::cout << " something error while connect. error :  " << error << std::endl;
        }
    }